

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::AddPackage
          (DescriptorBuilder *this,string_view name,Message *proto,FileDescriptor *file,
          bool toplevel)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  bool bVar1;
  Symbol symbol;
  size_type __n;
  char *pcVar2;
  pointer pcVar3;
  lts_20250127 *this_00;
  Tables *this_01;
  basic_string_view<char,_std::char_traits<char>_> name_00;
  string_view name_01;
  string_view haystack;
  string_view element_name;
  string_view full_name;
  string_view full_name_00;
  code *pcVar4;
  string_view name_local;
  Symbol existing_symbol;
  string_view *local_48;
  FileDescriptor **local_40;
  FileDescriptor *other_file;
  
  pcVar2 = name._M_str;
  this_00 = (lts_20250127 *)name._M_len;
  haystack._M_str = (char *)0x0;
  haystack._M_len = (size_t)pcVar2;
  name_local._M_len = (size_t)this_00;
  name_local._M_str = pcVar2;
  bVar1 = absl::lts_20250127::StrContains(this_00,haystack,(char)proto);
  if (bVar1) {
    pcVar4 = absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::AddPackage(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::FileDescriptor*,bool)::__0,std::__cxx11::string>
    ;
  }
  else {
    existing_symbol = DescriptorPool::Tables::FindSymbol(this->tables_,name);
    if ((existing_symbol.ptr_)->symbol_type_ == '\0') {
      this_01 = this->tables_;
      if (toplevel) {
        pcVar3 = (file->package_->_M_dataplus)._M_p;
        this_00 = (lts_20250127 *)file->package_->_M_string_length;
        (file->super_SymbolBase).symbol_type_ = '\t';
        symbol.ptr_ = &file->super_SymbolBase;
      }
      else {
        symbol.ptr_ = &DescriptorPool::Tables::Allocate<google::protobuf::Symbol::Subpackage>
                                 (this_01)->super_SymbolBase;
        ((Subpackage *)symbol.ptr_)->name_size = (int)name._M_len;
        ((Subpackage *)symbol.ptr_)->file = file;
        this_01 = this->tables_;
        (((Subpackage *)symbol.ptr_)->super_SymbolBase).symbol_type_ = '\n';
        pcVar3 = name_local._M_str;
      }
      full_name._M_str = pcVar3;
      full_name._M_len = (size_t)this_00;
      DescriptorPool::Tables::AddSymbol(this_01,full_name,symbol);
      __n = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                      (&name_local,'.',0xffffffffffffffff);
      if (__n == 0xffffffffffffffff) {
        name_01._M_str = name_local._M_str;
        name_01._M_len = name_local._M_len;
      }
      else {
        name_00 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&name_local,0,__n);
        AddPackage(this,name_00,proto,file,false);
        name_01 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                            (&name_local,__n + 1,0xffffffffffffffff);
      }
      full_name_00._M_str = name_local._M_str;
      full_name_00._M_len = name_local._M_len;
      ValidateSymbolName(this,name_01,full_name_00,proto);
      return;
    }
    if ((byte)((existing_symbol.ptr_)->symbol_type_ - 9) < 2) {
      return;
    }
    other_file = Symbol::GetFile(&existing_symbol);
    local_40 = &other_file;
    pcVar4 = absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::AddPackage(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::Message_const&,google::protobuf::FileDescriptor*,bool)::__1,std::__cxx11::string>
    ;
    pcVar2 = name_local._M_str;
    this_00 = (lts_20250127 *)name_local._M_len;
  }
  local_48 = &name_local;
  make_error.invoker_ = pcVar4;
  make_error.ptr_.obj = &local_48;
  element_name._M_str = pcVar2;
  element_name._M_len = (size_t)this_00;
  AddError(this,element_name,proto,NAME,make_error);
  return;
}

Assistant:

void DescriptorBuilder::AddPackage(const absl::string_view name,
                                   const Message& proto, FileDescriptor* file,
                                   bool toplevel) {
  if (absl::StrContains(name, '\0')) {
    AddError(name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
      return absl::StrCat("\"", name, "\" contains null character.");
    });
    return;
  }

  Symbol existing_symbol = tables_->FindSymbol(name);
  // It's OK to redefine a package.
  if (existing_symbol.IsNull()) {
    if (toplevel) {
      // It is the toplevel package name, so insert the descriptor directly.
      tables_->AddSymbol(file->package(), Symbol(file));
    } else {
      auto* package = tables_->Allocate<Symbol::Subpackage>();
      // If the name is the package name, then it is already in the arena.
      // If not, copy it there. It came from the call to AddPackage below.
      package->name_size = static_cast<int>(name.size());
      package->file = file;
      tables_->AddSymbol(name, Symbol(package));
    }
    // Also add parent package, if any.
    std::string::size_type dot_pos = name.find_last_of('.');
    if (dot_pos == std::string::npos) {
      // No parents.
      ValidateSymbolName(name, name, proto);
    } else {
      // Has parent.
      AddPackage(name.substr(0, dot_pos), proto, file, false);
      ValidateSymbolName(name.substr(dot_pos + 1), name, proto);
    }
  } else if (!existing_symbol.IsPackage()) {
    // Symbol seems to have been defined in a different file.
    const FileDescriptor* other_file = existing_symbol.GetFile();
    AddError(name, proto, DescriptorPool::ErrorCollector::NAME, [&] {
      return absl::StrCat("\"", name,
                          "\" is already defined (as something other than "
                          "a package) in file \"",
                          (other_file == nullptr ? "null" : other_file->name()),
                          "\".");
    });
  }
}